

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_it_rec_dc_sse42_intr.c
# Opt level: O0

void ihevcd_itrans_recon_dc_chroma_sse42
               (UWORD8 *pu1_pred,UWORD8 *pu1_dst,WORD32 pred_strd,WORD32 dst_strd,
               WORD32 log2_trans_size,WORD16 i2_coeff_value)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  int iVar12;
  undefined8 *puVar13;
  int in_ECX;
  int in_EDX;
  undefined1 (*in_RSI) [16];
  undefined1 (*in_RDI) [16];
  byte in_R8B;
  short in_R9W;
  short sVar14;
  short sVar22;
  short sVar24;
  short sVar26;
  short sVar28;
  short sVar29;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar37;
  short sVar38;
  short sVar39;
  short sVar40;
  short sVar41;
  short sVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  short sVar15;
  short sVar23;
  short sVar25;
  short sVar27;
  short sVar30;
  short sVar36;
  short sVar42;
  short sVar47;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  LWORD64 shuffle_mask;
  WORD32 unchanged_mask_4x4;
  WORD32 shuffle_mask_4x4;
  WORD32 trans_size;
  WORD32 quant_out;
  WORD32 dc_value;
  WORD32 shift;
  WORD32 add;
  __m128i *pi4_dst;
  __m128i zero_8x16b;
  __m128i m_temp_reg_20;
  __m128i m_temp_reg_15;
  __m128i m_temp_reg_14;
  __m128i m_temp_reg_13;
  __m128i m_temp_reg_12;
  __m128i m_temp_reg_11;
  __m128i m_temp_reg_10;
  __m128i m_temp_reg_9;
  __m128i m_temp_reg_8;
  __m128i m_temp_reg_7;
  __m128i m_temp_reg_6;
  __m128i m_temp_reg_5;
  __m128i m_temp_reg_4;
  __m128i m_temp_reg_3;
  __m128i m_temp_reg_2;
  __m128i m_temp_reg_1;
  __m128i m_temp_reg_0;
  short local_a88;
  short local_a84;
  int local_a80;
  int local_a7c;
  int local_a50;
  int local_a4c;
  byte local_9c8;
  byte bStack_9c7;
  byte bStack_9c6;
  byte bStack_9c5;
  byte bStack_9c4;
  byte bStack_9c3;
  byte bStack_9c2;
  byte bStack_9c1;
  byte local_9b8;
  byte bStack_9b7;
  byte bStack_9b6;
  byte bStack_9b5;
  byte bStack_9b4;
  byte bStack_9b3;
  byte bStack_9b2;
  byte bStack_9b1;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 local_988;
  undefined8 local_978;
  undefined8 local_968;
  ushort local_948;
  ushort local_938;
  ushort local_928;
  ushort local_918;
  undefined1 (*local_8b0) [16];
  undefined1 (*local_8a8) [16];
  undefined1 local_708;
  undefined1 uStack_707;
  undefined1 uStack_706;
  undefined1 uStack_705;
  undefined1 uStack_704;
  undefined1 uStack_703;
  undefined1 uStack_702;
  undefined1 uStack_701;
  undefined1 local_6e8;
  undefined1 uStack_6e7;
  undefined1 uStack_6e6;
  undefined1 uStack_6e5;
  undefined1 uStack_6e4;
  undefined1 uStack_6e3;
  undefined1 uStack_6e2;
  undefined1 uStack_6e1;
  undefined1 local_6c8;
  undefined1 uStack_6c7;
  undefined1 uStack_6c6;
  undefined1 uStack_6c5;
  undefined1 uStack_6c4;
  undefined1 uStack_6c3;
  undefined1 uStack_6c2;
  undefined1 uStack_6c1;
  undefined1 local_6a8;
  undefined1 uStack_6a7;
  undefined1 uStack_6a6;
  undefined1 uStack_6a5;
  undefined1 uStack_6a4;
  undefined1 uStack_6a3;
  undefined1 uStack_6a2;
  undefined1 uStack_6a1;
  byte local_678;
  byte bStack_677;
  byte bStack_676;
  byte bStack_675;
  byte bStack_674;
  byte bStack_673;
  byte bStack_672;
  byte bStack_671;
  byte local_658;
  byte bStack_657;
  byte bStack_656;
  byte bStack_655;
  byte bStack_654;
  byte bStack_653;
  byte bStack_652;
  byte bStack_651;
  byte local_638;
  byte bStack_637;
  byte bStack_636;
  byte bStack_635;
  byte bStack_634;
  byte bStack_633;
  byte bStack_632;
  byte bStack_631;
  byte local_618;
  byte bStack_617;
  byte bStack_616;
  byte bStack_615;
  byte bStack_614;
  byte bStack_613;
  byte bStack_612;
  byte bStack_611;
  undefined1 local_608;
  undefined1 uStack_607;
  undefined1 uStack_606;
  undefined1 uStack_605;
  undefined1 local_5e8;
  undefined1 uStack_5e7;
  undefined1 uStack_5e6;
  undefined1 uStack_5e5;
  undefined1 local_5c8;
  undefined1 uStack_5c7;
  undefined1 uStack_5c6;
  undefined1 uStack_5c5;
  undefined1 local_5a8;
  undefined1 uStack_5a7;
  undefined1 uStack_5a6;
  undefined1 uStack_5a5;
  ushort uStack_536;
  ushort uStack_534;
  ushort uStack_532;
  ushort uStack_530;
  ushort uStack_52e;
  ushort uStack_52c;
  ushort uStack_52a;
  ushort uStack_516;
  ushort uStack_514;
  ushort uStack_512;
  ushort uStack_510;
  ushort uStack_50e;
  ushort uStack_50c;
  ushort uStack_50a;
  ushort uStack_4f6;
  ushort uStack_4f4;
  ushort uStack_4f2;
  ushort uStack_4f0;
  ushort uStack_4ee;
  ushort uStack_4ec;
  ushort uStack_4ea;
  ushort uStack_4d6;
  ushort uStack_4d4;
  ushort uStack_4d2;
  ushort uStack_4d0;
  ushort uStack_4ce;
  ushort uStack_4cc;
  ushort uStack_4ca;
  ushort uStack_4b6;
  ushort uStack_4b4;
  ushort uStack_4b2;
  ushort uStack_4b0;
  ushort uStack_4ae;
  ushort uStack_4ac;
  ushort uStack_4aa;
  ushort uStack_496;
  ushort uStack_494;
  ushort uStack_492;
  ushort uStack_490;
  ushort uStack_48e;
  ushort uStack_48c;
  ushort uStack_48a;
  ulong local_2a8;
  ulong local_288;
  __m128i chroma_unchanged_mask_16x8b_1;
  __m128i chroma_shuffle_mask_16x8b_1;
  WORD32 j;
  WORD32 i;
  __m128i chroma_unchanged_mask_16x8b;
  __m128i chroma_shuffle_mask_16x8b;
  LWORD64 unchanged_mask;
  
  iVar11 = 1 << (in_R8B & 0x1f);
  iVar12 = (int)in_R9W;
  if (iVar12 * 0x40 + 0x40 >> 7 < 0x8000) {
    if (iVar12 * 0x40 + 0x40 >> 7 < -0x8000) {
      local_a80 = -0x8000;
    }
    else {
      local_a80 = iVar12 * 0x40 + 0x40 >> 7;
    }
    local_a7c = local_a80;
  }
  else {
    local_a7c = 0x7fff;
  }
  if (local_a7c * 0x40 + 0x800 >> 0xc < 0x8000) {
    if (local_a7c * 0x40 + 0x800 >> 0xc < -0x8000) {
      local_a88 = -0x8000;
    }
    else {
      local_a88 = (short)(local_a7c * 0x40 + 0x800 >> 0xc);
    }
    local_a84 = local_a88;
  }
  else {
    local_a84 = 0x7fff;
  }
  if (iVar11 == 4) {
    local_288 = SUB168(ZEXT416(0x6040200),0);
    local_2a8 = SUB168(ZEXT416(0x7050301),0);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = *(ulong *)*in_RDI;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = local_288;
    auVar16 = pshufb(auVar10,auVar9);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = *(ulong *)(*in_RDI + in_EDX);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_288;
    auVar17 = pshufb(auVar8,auVar7);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = *(ulong *)(*in_RDI + in_EDX * 2);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_288;
    auVar18 = pshufb(auVar6,auVar5);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = *(ulong *)(*in_RDI + in_EDX * 3);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_288;
    auVar19 = pshufb(auVar4,auVar3);
    local_9b8 = auVar16[0];
    bStack_9b7 = auVar16[1];
    bStack_9b6 = auVar16[2];
    bStack_9b5 = auVar16[3];
    bStack_9b4 = auVar17[0];
    bStack_9b3 = auVar17[1];
    bStack_9b2 = auVar17[2];
    bStack_9b1 = auVar17[3];
    local_9c8 = auVar18[0];
    bStack_9c7 = auVar18[1];
    bStack_9c6 = auVar18[2];
    bStack_9c5 = auVar18[3];
    bStack_9c4 = auVar19[0];
    bStack_9c3 = auVar19[1];
    bStack_9c2 = auVar19[2];
    bStack_9c1 = auVar19[3];
    local_918 = (ushort)local_9b8;
    local_928 = (ushort)local_9c8;
    uStack_496 = (ushort)bStack_9b7;
    uStack_494 = (ushort)bStack_9b6;
    uStack_492 = (ushort)bStack_9b5;
    uStack_490 = (ushort)bStack_9b4;
    uStack_48e = (ushort)bStack_9b3;
    uStack_48c = (ushort)bStack_9b2;
    uStack_48a = (ushort)bStack_9b1;
    sVar14 = local_918 + local_a84;
    sVar22 = uStack_496 + local_a84;
    sVar24 = uStack_494 + local_a84;
    sVar26 = uStack_492 + local_a84;
    sVar29 = uStack_490 + local_a84;
    sVar35 = uStack_48e + local_a84;
    sVar41 = uStack_48c + local_a84;
    sVar47 = uStack_48a + local_a84;
    uStack_4b6 = (ushort)bStack_9c7;
    uStack_4b4 = (ushort)bStack_9c6;
    uStack_4b2 = (ushort)bStack_9c5;
    uStack_4b0 = (ushort)bStack_9c4;
    uStack_4ae = (ushort)bStack_9c3;
    uStack_4ac = (ushort)bStack_9c2;
    uStack_4aa = (ushort)bStack_9c1;
    sVar15 = local_928 + local_a84;
    sVar23 = uStack_4b6 + local_a84;
    sVar25 = uStack_4b4 + local_a84;
    sVar27 = uStack_4b2 + local_a84;
    sVar30 = uStack_4b0 + local_a84;
    sVar36 = uStack_4ae + local_a84;
    sVar42 = uStack_4ac + local_a84;
    local_a84 = uStack_4aa + local_a84;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = *(ulong *)*in_RSI;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = local_2a8;
    auVar20 = pshufb(auVar2,auVar20);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = *(ulong *)(*in_RSI + in_ECX);
    auVar21._8_8_ = 0;
    auVar21._0_8_ = local_2a8;
    auVar21 = pshufb(auVar1,auVar21);
    auVar19._8_8_ = 0;
    auVar19._0_8_ = *(ulong *)(*in_RSI + in_ECX * 2);
    auVar18._8_8_ = 0;
    auVar18._0_8_ = local_2a8;
    auVar18 = pshufb(auVar19,auVar18);
    auVar17._8_8_ = 0;
    auVar17._0_8_ = *(ulong *)(*in_RSI + in_ECX * 3);
    auVar16._8_8_ = 0;
    auVar16._0_8_ = local_2a8;
    auVar16 = pshufb(auVar17,auVar16);
    local_5a8 = auVar20[0];
    uStack_5a7 = auVar20[1];
    uStack_5a6 = auVar20[2];
    uStack_5a5 = auVar20[3];
    local_968 = CONCAT17(uStack_5a5,
                         CONCAT16((0 < sVar26) * (sVar26 < 0x100) * (char)sVar26 - (0xff < sVar26),
                                  CONCAT15(uStack_5a6,
                                           CONCAT14((0 < sVar24) * (sVar24 < 0x100) * (char)sVar24 -
                                                    (0xff < sVar24),
                                                    CONCAT13(uStack_5a7,
                                                             CONCAT12((0 < sVar22) *
                                                                      (sVar22 < 0x100) *
                                                                      (char)sVar22 - (0xff < sVar22)
                                                                      ,CONCAT11(local_5a8,
                                                                                (0 < sVar14) *
                                                                                (sVar14 < 0x100) *
                                                                                (char)sVar14 -
                                                                                (0xff < sVar14))))))
                                 ));
    local_5c8 = auVar21[0];
    uStack_5c7 = auVar21[1];
    uStack_5c6 = auVar21[2];
    uStack_5c5 = auVar21[3];
    local_978 = CONCAT17(uStack_5c5,
                         CONCAT16((0 < sVar47) * (sVar47 < 0x100) * (char)sVar47 - (0xff < sVar47),
                                  CONCAT15(uStack_5c6,
                                           CONCAT14((0 < sVar41) * (sVar41 < 0x100) * (char)sVar41 -
                                                    (0xff < sVar41),
                                                    CONCAT13(uStack_5c7,
                                                             CONCAT12((0 < sVar35) *
                                                                      (sVar35 < 0x100) *
                                                                      (char)sVar35 - (0xff < sVar35)
                                                                      ,CONCAT11(local_5c8,
                                                                                (0 < sVar29) *
                                                                                (sVar29 < 0x100) *
                                                                                (char)sVar29 -
                                                                                (0xff < sVar29))))))
                                 ));
    local_5e8 = auVar18[0];
    uStack_5e7 = auVar18[1];
    uStack_5e6 = auVar18[2];
    uStack_5e5 = auVar18[3];
    local_988 = CONCAT17(uStack_5e5,
                         CONCAT16((0 < sVar27) * (sVar27 < 0x100) * (char)sVar27 - (0xff < sVar27),
                                  CONCAT15(uStack_5e6,
                                           CONCAT14((0 < sVar25) * (sVar25 < 0x100) * (char)sVar25 -
                                                    (0xff < sVar25),
                                                    CONCAT13(uStack_5e7,
                                                             CONCAT12((0 < sVar23) *
                                                                      (sVar23 < 0x100) *
                                                                      (char)sVar23 - (0xff < sVar23)
                                                                      ,CONCAT11(local_5e8,
                                                                                (0 < sVar15) *
                                                                                (sVar15 < 0x100) *
                                                                                (char)sVar15 -
                                                                                (0xff < sVar15))))))
                                 ));
    local_608 = auVar16[0];
    uStack_607 = auVar16[1];
    uStack_606 = auVar16[2];
    uStack_605 = auVar16[3];
    local_998._0_2_ =
         CONCAT11(local_608,(0 < sVar30) * (sVar30 < 0x100) * (char)sVar30 - (0xff < sVar30));
    local_998._0_3_ =
         CONCAT12((0 < sVar36) * (sVar36 < 0x100) * (char)sVar36 - (0xff < sVar36),
                  (undefined2)local_998);
    local_998._0_4_ = CONCAT13(uStack_607,(undefined3)local_998);
    local_998._0_5_ =
         CONCAT14((0 < sVar42) * (sVar42 < 0x100) * (char)sVar42 - (0xff < sVar42),
                  (undefined4)local_998);
    local_998._0_6_ = CONCAT15(uStack_606,(undefined5)local_998);
    local_998._0_7_ =
         CONCAT16((0 < local_a84) * (local_a84 < 0x100) * (char)local_a84 - (0xff < local_a84),
                  (undefined6)local_998);
    local_998 = CONCAT17(uStack_605,(undefined7)local_998);
    *(undefined8 *)*in_RSI = local_968;
    *(undefined8 *)(*in_RSI + in_ECX) = local_978;
    puVar13 = (undefined8 *)((long)(*in_RSI + in_ECX) + (long)in_ECX);
    *puVar13 = local_988;
    *(undefined8 *)((long)puVar13 + (long)in_ECX) = local_998;
  }
  else {
    local_8b0 = in_RSI;
    local_8a8 = in_RDI;
    for (local_a4c = 0; local_a4c < iVar11; local_a4c = local_a4c + 4) {
      for (local_a50 = 0; local_a50 < iVar11; local_a50 = local_a50 + 8) {
        auVar16 = pshufb(*local_8a8,ZEXT816(0xe0c0a0806040200));
        auVar17 = pshufb(*(undefined1 (*) [16])(*local_8a8 + in_EDX),ZEXT816(0xe0c0a0806040200));
        auVar18 = pshufb(*(undefined1 (*) [16])(*local_8a8 + in_EDX * 2),ZEXT816(0xe0c0a0806040200))
        ;
        auVar19 = pshufb(*(undefined1 (*) [16])(*local_8a8 + in_EDX * 3),ZEXT816(0xe0c0a0806040200))
        ;
        local_618 = auVar16[0];
        bStack_617 = auVar16[1];
        bStack_616 = auVar16[2];
        bStack_615 = auVar16[3];
        bStack_614 = auVar16[4];
        bStack_613 = auVar16[5];
        bStack_612 = auVar16[6];
        bStack_611 = auVar16[7];
        local_918 = (ushort)local_618;
        local_638 = auVar17[0];
        bStack_637 = auVar17[1];
        bStack_636 = auVar17[2];
        bStack_635 = auVar17[3];
        bStack_634 = auVar17[4];
        bStack_633 = auVar17[5];
        bStack_632 = auVar17[6];
        bStack_631 = auVar17[7];
        local_928 = (ushort)local_638;
        local_658 = auVar18[0];
        bStack_657 = auVar18[1];
        bStack_656 = auVar18[2];
        bStack_655 = auVar18[3];
        bStack_654 = auVar18[4];
        bStack_653 = auVar18[5];
        bStack_652 = auVar18[6];
        bStack_651 = auVar18[7];
        local_938 = (ushort)local_658;
        local_678 = auVar19[0];
        bStack_677 = auVar19[1];
        bStack_676 = auVar19[2];
        bStack_675 = auVar19[3];
        bStack_674 = auVar19[4];
        bStack_673 = auVar19[5];
        bStack_672 = auVar19[6];
        bStack_671 = auVar19[7];
        local_948 = (ushort)local_678;
        uStack_4d6 = (ushort)bStack_617;
        uStack_4d4 = (ushort)bStack_616;
        uStack_4d2 = (ushort)bStack_615;
        uStack_4d0 = (ushort)bStack_614;
        uStack_4ce = (ushort)bStack_613;
        uStack_4cc = (ushort)bStack_612;
        uStack_4ca = (ushort)bStack_611;
        sVar14 = local_918 + local_a84;
        sVar24 = uStack_4d6 + local_a84;
        sVar29 = uStack_4d4 + local_a84;
        sVar41 = uStack_4d2 + local_a84;
        sVar31 = uStack_4d0 + local_a84;
        sVar37 = uStack_4ce + local_a84;
        sVar43 = uStack_4cc + local_a84;
        sVar48 = uStack_4ca + local_a84;
        uStack_4f6 = (ushort)bStack_637;
        uStack_4f4 = (ushort)bStack_636;
        uStack_4f2 = (ushort)bStack_635;
        uStack_4f0 = (ushort)bStack_634;
        uStack_4ee = (ushort)bStack_633;
        uStack_4ec = (ushort)bStack_632;
        uStack_4ea = (ushort)bStack_631;
        sVar15 = local_928 + local_a84;
        sVar25 = uStack_4f6 + local_a84;
        sVar30 = uStack_4f4 + local_a84;
        sVar42 = uStack_4f2 + local_a84;
        sVar32 = uStack_4f0 + local_a84;
        sVar38 = uStack_4ee + local_a84;
        sVar44 = uStack_4ec + local_a84;
        sVar49 = uStack_4ea + local_a84;
        uStack_516 = (ushort)bStack_657;
        uStack_514 = (ushort)bStack_656;
        uStack_512 = (ushort)bStack_655;
        uStack_510 = (ushort)bStack_654;
        uStack_50e = (ushort)bStack_653;
        uStack_50c = (ushort)bStack_652;
        uStack_50a = (ushort)bStack_651;
        sVar22 = local_938 + local_a84;
        sVar26 = uStack_516 + local_a84;
        sVar35 = uStack_514 + local_a84;
        sVar47 = uStack_512 + local_a84;
        sVar33 = uStack_510 + local_a84;
        sVar39 = uStack_50e + local_a84;
        sVar45 = uStack_50c + local_a84;
        sVar50 = uStack_50a + local_a84;
        uStack_536 = (ushort)bStack_677;
        uStack_534 = (ushort)bStack_676;
        uStack_532 = (ushort)bStack_675;
        uStack_530 = (ushort)bStack_674;
        uStack_52e = (ushort)bStack_673;
        uStack_52c = (ushort)bStack_672;
        uStack_52a = (ushort)bStack_671;
        sVar23 = local_948 + local_a84;
        sVar27 = uStack_536 + local_a84;
        sVar36 = uStack_534 + local_a84;
        sVar28 = uStack_532 + local_a84;
        sVar34 = uStack_530 + local_a84;
        sVar40 = uStack_52e + local_a84;
        sVar46 = uStack_52c + local_a84;
        sVar51 = uStack_52a + local_a84;
        auVar16 = pshufb(*local_8b0,ZEXT816(0xf0d0b0907050301));
        auVar17 = pshufb(*(undefined1 (*) [16])(*local_8b0 + in_ECX),ZEXT816(0xf0d0b0907050301));
        auVar18 = pshufb(*(undefined1 (*) [16])(*local_8b0 + in_ECX * 2),ZEXT816(0xf0d0b0907050301))
        ;
        auVar19 = pshufb(*(undefined1 (*) [16])(*local_8b0 + in_ECX * 3),ZEXT816(0xf0d0b0907050301))
        ;
        local_6a8 = auVar16[0];
        uStack_6a7 = auVar16[1];
        uStack_6a6 = auVar16[2];
        uStack_6a5 = auVar16[3];
        uStack_6a4 = auVar16[4];
        uStack_6a3 = auVar16[5];
        uStack_6a2 = auVar16[6];
        uStack_6a1 = auVar16[7];
        local_998._0_2_ =
             CONCAT11(local_6a8,(0 < sVar14) * (sVar14 < 0x100) * (char)sVar14 - (0xff < sVar14));
        local_998._0_3_ =
             CONCAT12((0 < sVar24) * (sVar24 < 0x100) * (char)sVar24 - (0xff < sVar24),
                      (undefined2)local_998);
        local_998._0_4_ = CONCAT13(uStack_6a7,(undefined3)local_998);
        local_998._0_5_ =
             CONCAT14((0 < sVar29) * (sVar29 < 0x100) * (char)sVar29 - (0xff < sVar29),
                      (undefined4)local_998);
        local_998._0_6_ = CONCAT15(uStack_6a6,(undefined5)local_998);
        local_998._0_7_ =
             CONCAT16((0 < sVar41) * (sVar41 < 0x100) * (char)sVar41 - (0xff < sVar41),
                      (undefined6)local_998);
        local_998 = CONCAT17(uStack_6a5,(undefined7)local_998);
        uStack_990._0_1_ = (0 < sVar31) * (sVar31 < 0x100) * (char)sVar31 - (0xff < sVar31);
        uStack_990._1_1_ = uStack_6a4;
        uStack_990._2_1_ = (0 < sVar37) * (sVar37 < 0x100) * (char)sVar37 - (0xff < sVar37);
        uStack_990._3_1_ = uStack_6a3;
        uStack_990._4_1_ = (0 < sVar43) * (sVar43 < 0x100) * (char)sVar43 - (0xff < sVar43);
        uStack_990._5_1_ = uStack_6a2;
        uStack_990._6_1_ = (0 < sVar48) * (sVar48 < 0x100) * (char)sVar48 - (0xff < sVar48);
        uStack_990._7_1_ = uStack_6a1;
        local_6c8 = auVar17[0];
        uStack_6c7 = auVar17[1];
        uStack_6c6 = auVar17[2];
        uStack_6c5 = auVar17[3];
        uStack_6c4 = auVar17[4];
        uStack_6c3 = auVar17[5];
        uStack_6c2 = auVar17[6];
        uStack_6c1 = auVar17[7];
        local_9a8._0_2_ =
             CONCAT11(local_6c8,(0 < sVar15) * (sVar15 < 0x100) * (char)sVar15 - (0xff < sVar15));
        local_9a8._0_3_ =
             CONCAT12((0 < sVar25) * (sVar25 < 0x100) * (char)sVar25 - (0xff < sVar25),
                      (undefined2)local_9a8);
        local_9a8._0_4_ = CONCAT13(uStack_6c7,(undefined3)local_9a8);
        local_9a8._0_5_ =
             CONCAT14((0 < sVar30) * (sVar30 < 0x100) * (char)sVar30 - (0xff < sVar30),
                      (undefined4)local_9a8);
        local_9a8._0_6_ = CONCAT15(uStack_6c6,(undefined5)local_9a8);
        local_9a8._0_7_ =
             CONCAT16((0 < sVar42) * (sVar42 < 0x100) * (char)sVar42 - (0xff < sVar42),
                      (undefined6)local_9a8);
        local_9a8 = CONCAT17(uStack_6c5,(undefined7)local_9a8);
        uStack_9a0._0_1_ = (0 < sVar32) * (sVar32 < 0x100) * (char)sVar32 - (0xff < sVar32);
        uStack_9a0._1_1_ = uStack_6c4;
        uStack_9a0._2_1_ = (0 < sVar38) * (sVar38 < 0x100) * (char)sVar38 - (0xff < sVar38);
        uStack_9a0._3_1_ = uStack_6c3;
        uStack_9a0._4_1_ = (0 < sVar44) * (sVar44 < 0x100) * (char)sVar44 - (0xff < sVar44);
        uStack_9a0._5_1_ = uStack_6c2;
        uStack_9a0._6_1_ = (0 < sVar49) * (sVar49 < 0x100) * (char)sVar49 - (0xff < sVar49);
        uStack_9a0._7_1_ = uStack_6c1;
        local_6e8 = auVar18[0];
        uStack_6e7 = auVar18[1];
        uStack_6e6 = auVar18[2];
        uStack_6e5 = auVar18[3];
        uStack_6e4 = auVar18[4];
        uStack_6e3 = auVar18[5];
        uStack_6e2 = auVar18[6];
        uStack_6e1 = auVar18[7];
        local_708 = auVar19[0];
        uStack_707 = auVar19[1];
        uStack_706 = auVar19[2];
        uStack_705 = auVar19[3];
        uStack_704 = auVar19[4];
        uStack_703 = auVar19[5];
        uStack_702 = auVar19[6];
        uStack_701 = auVar19[7];
        *(undefined8 *)*local_8b0 = local_998;
        *(undefined8 *)(*local_8b0 + 8) = uStack_990;
        *(undefined8 *)(*local_8b0 + in_ECX) = local_9a8;
        *(undefined8 *)(*local_8b0 + (long)in_ECX + 8) = uStack_9a0;
        *(ulong *)(*local_8b0 + in_ECX * 2) =
             CONCAT17(uStack_6e5,
                      CONCAT16((0 < sVar47) * (sVar47 < 0x100) * (char)sVar47 - (0xff < sVar47),
                               CONCAT15(uStack_6e6,
                                        CONCAT14((0 < sVar35) * (sVar35 < 0x100) * (char)sVar35 -
                                                 (0xff < sVar35),
                                                 CONCAT13(uStack_6e7,
                                                          CONCAT12((0 < sVar26) * (sVar26 < 0x100) *
                                                                   (char)sVar26 - (0xff < sVar26),
                                                                   CONCAT11(local_6e8,
                                                                            (0 < sVar22) *
                                                                            (sVar22 < 0x100) *
                                                                            (char)sVar22 -
                                                                            (0xff < sVar22))))))));
        *(ulong *)(*local_8b0 + (long)(in_ECX * 2) + 8) =
             CONCAT17(uStack_6e1,
                      CONCAT16((0 < sVar50) * (sVar50 < 0x100) * (char)sVar50 - (0xff < sVar50),
                               CONCAT15(uStack_6e2,
                                        CONCAT14((0 < sVar45) * (sVar45 < 0x100) * (char)sVar45 -
                                                 (0xff < sVar45),
                                                 CONCAT13(uStack_6e3,
                                                          CONCAT12((0 < sVar39) * (sVar39 < 0x100) *
                                                                   (char)sVar39 - (0xff < sVar39),
                                                                   CONCAT11(uStack_6e4,
                                                                            (0 < sVar33) *
                                                                            (sVar33 < 0x100) *
                                                                            (char)sVar33 -
                                                                            (0xff < sVar33))))))));
        *(ulong *)(*local_8b0 + in_ECX * 3) =
             CONCAT17(uStack_705,
                      CONCAT16((0 < sVar28) * (sVar28 < 0x100) * (char)sVar28 - (0xff < sVar28),
                               CONCAT15(uStack_706,
                                        CONCAT14((0 < sVar36) * (sVar36 < 0x100) * (char)sVar36 -
                                                 (0xff < sVar36),
                                                 CONCAT13(uStack_707,
                                                          CONCAT12((0 < sVar27) * (sVar27 < 0x100) *
                                                                   (char)sVar27 - (0xff < sVar27),
                                                                   CONCAT11(local_708,
                                                                            (0 < sVar23) *
                                                                            (sVar23 < 0x100) *
                                                                            (char)sVar23 -
                                                                            (0xff < sVar23))))))));
        *(ulong *)(*local_8b0 + (long)(in_ECX * 3) + 8) =
             CONCAT17(uStack_701,
                      CONCAT16((0 < sVar51) * (sVar51 < 0x100) * (char)sVar51 - (0xff < sVar51),
                               CONCAT15(uStack_702,
                                        CONCAT14((0 < sVar46) * (sVar46 < 0x100) * (char)sVar46 -
                                                 (0xff < sVar46),
                                                 CONCAT13(uStack_703,
                                                          CONCAT12((0 < sVar40) * (sVar40 < 0x100) *
                                                                   (char)sVar40 - (0xff < sVar40),
                                                                   CONCAT11(uStack_704,
                                                                            (0 < sVar34) *
                                                                            (sVar34 < 0x100) *
                                                                            (char)sVar34 -
                                                                            (0xff < sVar34))))))));
        local_8a8 = local_8a8 + 1;
        local_8b0 = local_8b0 + 1;
      }
      local_8a8 = (undefined1 (*) [16])(*local_8a8 + (in_EDX * 4 + iVar11 * -2));
      local_8b0 = (undefined1 (*) [16])(*local_8b0 + (in_ECX * 4 + iVar11 * -2));
    }
  }
  return;
}

Assistant:

void ihevcd_itrans_recon_dc_chroma_sse42(UWORD8 *pu1_pred, UWORD8 *pu1_dst, WORD32 pred_strd, WORD32 dst_strd,
                                         WORD32 log2_trans_size, WORD16 i2_coeff_value)
{
    __m128i m_temp_reg_0;
    __m128i m_temp_reg_1;
    __m128i m_temp_reg_2;
    __m128i m_temp_reg_3;
    __m128i m_temp_reg_4;
    __m128i m_temp_reg_5;
    __m128i m_temp_reg_6;
    __m128i m_temp_reg_7;
    __m128i m_temp_reg_8;
    __m128i m_temp_reg_9;
    __m128i m_temp_reg_10;
    __m128i m_temp_reg_11;
    __m128i m_temp_reg_12;
    __m128i m_temp_reg_13;
    __m128i m_temp_reg_14;
    __m128i m_temp_reg_15;
    __m128i m_temp_reg_20, zero_8x16b;
    __m128i *pi4_dst = (__m128i *)pu1_dst;


    //WORD32 row,col;
    WORD32 add, shift;
    WORD32 dc_value, quant_out;
    WORD32 trans_size;


    WORD32 shuffle_mask_4x4 = 0x06040200;
    WORD32 unchanged_mask_4x4 = 0x07050301;
    LWORD64 shuffle_mask = 0x0E0C0A0806040200LL;
    LWORD64 unchanged_mask = 0x0F0D0B0907050301LL;

    trans_size = (1 << log2_trans_size);

    quant_out = i2_coeff_value;

    shift = IT_SHIFT_STAGE_1;
    add = 1 << (shift - 1);
    dc_value = CLIP_S16((quant_out * 64 + add) >> shift);
    shift = IT_SHIFT_STAGE_2;
    add = 1 << (shift - 1);
    dc_value = CLIP_S16((dc_value * 64 + add) >> shift);

    /*Replicate the DC value within 16 bits in 128 bit register*/
    m_temp_reg_20 = _mm_set1_epi16(dc_value);
    zero_8x16b = _mm_setzero_si128();

    if(trans_size == 4)
    {
        __m128i chroma_shuffle_mask_16x8b;
        __m128i chroma_unchanged_mask_16x8b;
        chroma_shuffle_mask_16x8b = _mm_cvtsi32_si128(shuffle_mask_4x4);
        chroma_unchanged_mask_16x8b = _mm_cvtsi32_si128(unchanged_mask_4x4);

        /*Load the prediction data*/
        m_temp_reg_0 = _mm_loadl_epi64((__m128i *)(pu1_pred));
        m_temp_reg_1 = _mm_loadl_epi64((__m128i *)(pu1_pred + pred_strd));
        m_temp_reg_2 = _mm_loadl_epi64((__m128i *)(pu1_pred + 2 * pred_strd));
        m_temp_reg_3 = _mm_loadl_epi64((__m128i *)(pu1_pred + 3 * pred_strd));

        m_temp_reg_10  = _mm_shuffle_epi8(m_temp_reg_0, chroma_shuffle_mask_16x8b);
        m_temp_reg_11  = _mm_shuffle_epi8(m_temp_reg_1, chroma_shuffle_mask_16x8b);
        m_temp_reg_12  = _mm_shuffle_epi8(m_temp_reg_2, chroma_shuffle_mask_16x8b);
        m_temp_reg_13  = _mm_shuffle_epi8(m_temp_reg_3, chroma_shuffle_mask_16x8b);

        m_temp_reg_14 = _mm_unpacklo_epi32(m_temp_reg_10, m_temp_reg_11);
        m_temp_reg_15 = _mm_unpacklo_epi32(m_temp_reg_12, m_temp_reg_13);

        m_temp_reg_4 = _mm_unpacklo_epi8(m_temp_reg_14, zero_8x16b);
        m_temp_reg_5 = _mm_unpacklo_epi8(m_temp_reg_15, zero_8x16b);

        m_temp_reg_6 = _mm_add_epi16(m_temp_reg_4, m_temp_reg_20);
        m_temp_reg_7 = _mm_add_epi16(m_temp_reg_5, m_temp_reg_20);

        /*Load the recon data to make sure that 'v' is not corrupted when 'u' is called and vice versa*/
        m_temp_reg_0 = _mm_loadl_epi64((__m128i *)pu1_dst);
        m_temp_reg_1 = _mm_loadl_epi64((__m128i *)(pu1_dst + dst_strd));
        m_temp_reg_2 = _mm_loadl_epi64((__m128i *)(pu1_dst + 2 * dst_strd));
        m_temp_reg_3 = _mm_loadl_epi64((__m128i *)(pu1_dst + 3 * dst_strd));

        m_temp_reg_0  = _mm_shuffle_epi8(m_temp_reg_0, chroma_unchanged_mask_16x8b);
        m_temp_reg_1  = _mm_shuffle_epi8(m_temp_reg_1, chroma_unchanged_mask_16x8b);
        m_temp_reg_2  = _mm_shuffle_epi8(m_temp_reg_2, chroma_unchanged_mask_16x8b);
        m_temp_reg_3  = _mm_shuffle_epi8(m_temp_reg_3, chroma_unchanged_mask_16x8b);


        m_temp_reg_8 = _mm_packus_epi16(m_temp_reg_6, m_temp_reg_7);
        m_temp_reg_9 = _mm_unpacklo_epi8(m_temp_reg_8, m_temp_reg_0);
        m_temp_reg_8 = _mm_srli_si128(m_temp_reg_8, 4);
        m_temp_reg_10 = _mm_unpacklo_epi8(m_temp_reg_8, m_temp_reg_1);
        m_temp_reg_8 = _mm_srli_si128(m_temp_reg_8, 4);
        m_temp_reg_11 = _mm_unpacklo_epi8(m_temp_reg_8, m_temp_reg_2);
        m_temp_reg_8 = _mm_srli_si128(m_temp_reg_8, 4);
        m_temp_reg_12 = _mm_unpacklo_epi8(m_temp_reg_8, m_temp_reg_3);

        /*Store the result in the destination*/
        _mm_storel_epi64(pi4_dst, m_temp_reg_9);
        pu1_dst += dst_strd;
        pi4_dst = (__m128i *)(pu1_dst);


        _mm_storel_epi64(pi4_dst, m_temp_reg_10);
        pu1_dst += dst_strd;
        pi4_dst = (__m128i *)(pu1_dst);

        _mm_storel_epi64(pi4_dst, m_temp_reg_11);
        pu1_dst += dst_strd;
        pi4_dst = (__m128i *)(pu1_dst);

        _mm_storel_epi64(pi4_dst, m_temp_reg_12);
    }
    else
    {
        WORD32 i, j;
        __m128i chroma_shuffle_mask_16x8b;
        __m128i chroma_unchanged_mask_16x8b;
        chroma_shuffle_mask_16x8b = _mm_loadl_epi64((__m128i *)(&shuffle_mask));
        chroma_unchanged_mask_16x8b =
                        _mm_loadl_epi64((__m128i *)(&unchanged_mask));

        for(i = 0; i < trans_size; i += 4)
        {
            for(j = 0; j < trans_size; j += 8)
            {

                m_temp_reg_0 = _mm_loadu_si128((__m128i *)pu1_pred);
                m_temp_reg_1 = _mm_loadu_si128((__m128i *)(pu1_pred + pred_strd));
                m_temp_reg_2 = _mm_loadu_si128((__m128i *)(pu1_pred + 2 * pred_strd));
                m_temp_reg_3 = _mm_loadu_si128((__m128i *)(pu1_pred + 3 * pred_strd));

                /*Retain only one chroma component*/
                m_temp_reg_4  = _mm_shuffle_epi8(m_temp_reg_0, chroma_shuffle_mask_16x8b);
                m_temp_reg_5  = _mm_shuffle_epi8(m_temp_reg_1, chroma_shuffle_mask_16x8b);
                m_temp_reg_6  = _mm_shuffle_epi8(m_temp_reg_2, chroma_shuffle_mask_16x8b);
                m_temp_reg_7  = _mm_shuffle_epi8(m_temp_reg_3, chroma_shuffle_mask_16x8b);

                m_temp_reg_4 = _mm_unpacklo_epi8(m_temp_reg_4, zero_8x16b);
                m_temp_reg_5 = _mm_unpacklo_epi8(m_temp_reg_5, zero_8x16b);
                m_temp_reg_6 = _mm_unpacklo_epi8(m_temp_reg_6, zero_8x16b);
                m_temp_reg_7 = _mm_unpacklo_epi8(m_temp_reg_7, zero_8x16b);

                m_temp_reg_8 = _mm_add_epi16(m_temp_reg_4, m_temp_reg_20);
                m_temp_reg_9 = _mm_add_epi16(m_temp_reg_5, m_temp_reg_20);
                m_temp_reg_10 = _mm_add_epi16(m_temp_reg_6, m_temp_reg_20);
                m_temp_reg_11 = _mm_add_epi16(m_temp_reg_7, m_temp_reg_20);


                /*Load the recon data to make sure that 'v' is not corrupted when 'u' is called and vice versa*/
                m_temp_reg_0 = _mm_loadu_si128((__m128i *)pu1_dst);
                m_temp_reg_1 = _mm_loadu_si128((__m128i *)(pu1_dst + dst_strd));
                m_temp_reg_2 = _mm_loadu_si128((__m128i *)(pu1_dst + 2 * dst_strd));
                m_temp_reg_3 = _mm_loadu_si128((__m128i *)(pu1_dst + 3 * dst_strd));

                m_temp_reg_0  = _mm_shuffle_epi8(m_temp_reg_0, chroma_unchanged_mask_16x8b);
                m_temp_reg_1  = _mm_shuffle_epi8(m_temp_reg_1, chroma_unchanged_mask_16x8b);
                m_temp_reg_2  = _mm_shuffle_epi8(m_temp_reg_2, chroma_unchanged_mask_16x8b);
                m_temp_reg_3  = _mm_shuffle_epi8(m_temp_reg_3, chroma_unchanged_mask_16x8b);

                m_temp_reg_4 = _mm_packus_epi16(m_temp_reg_8, m_temp_reg_9);
                m_temp_reg_5 = _mm_packus_epi16(m_temp_reg_10, m_temp_reg_11);

                m_temp_reg_12 = _mm_unpacklo_epi8(m_temp_reg_4, m_temp_reg_0);
                m_temp_reg_4 = _mm_srli_si128(m_temp_reg_4, 8);
                m_temp_reg_13 = _mm_unpacklo_epi8(m_temp_reg_4, m_temp_reg_1);

                m_temp_reg_14 = _mm_unpacklo_epi8(m_temp_reg_5, m_temp_reg_2);
                m_temp_reg_5 = _mm_srli_si128(m_temp_reg_5, 8);
                m_temp_reg_15 = _mm_unpacklo_epi8(m_temp_reg_5, m_temp_reg_3);

                /*Store the result in the destination*/
                pi4_dst = (__m128i *)(pu1_dst);

                _mm_storel_epi64(pi4_dst, m_temp_reg_12);
                m_temp_reg_8 = _mm_srli_si128(m_temp_reg_12, 8);

                pi4_dst = (__m128i *)(pu1_dst + 8);
                _mm_storel_epi64(pi4_dst, m_temp_reg_8);

                pi4_dst = (__m128i *)(pu1_dst + dst_strd);

                _mm_storel_epi64(pi4_dst, m_temp_reg_13);
                m_temp_reg_9 = _mm_srli_si128(m_temp_reg_13, 8);

                pi4_dst = (__m128i *)(pu1_dst + dst_strd + 8);
                _mm_storel_epi64(pi4_dst, m_temp_reg_9);

                pi4_dst = (__m128i *)(pu1_dst + 2 * dst_strd);

                _mm_storel_epi64(pi4_dst, m_temp_reg_14);
                m_temp_reg_10 = _mm_srli_si128(m_temp_reg_14, 8);

                pi4_dst = (__m128i *)(pu1_dst + 2 * dst_strd + 8);
                _mm_storel_epi64(pi4_dst, m_temp_reg_10);

                pi4_dst = (__m128i *)(pu1_dst + 3 * dst_strd);

                _mm_storel_epi64(pi4_dst, m_temp_reg_15);
                m_temp_reg_11 = _mm_srli_si128(m_temp_reg_15, 8);

                pi4_dst = (__m128i *)(pu1_dst + 3 * dst_strd + 8);
                _mm_storel_epi64(pi4_dst, m_temp_reg_11);

                pu1_pred += 16;
                pu1_dst += 16;
            }

            pu1_pred += 4 * pred_strd - 2 * trans_size;
            pu1_dst += 4 * dst_strd - 2 * trans_size;
        }
    }


}